

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PEFile.cpp
# Opt level: O0

offset_t __thiscall PEFile::rawToRva(PEFile *this,offset_t raw)

{
  undefined8 uVar1;
  int iVar2;
  undefined4 extraout_var;
  SectionHdrWrapper *this_00;
  offset_t oVar3;
  offset_t oVar4;
  ulong uVar5;
  bufsize_t bVar6;
  size_t sVar7;
  bufsize_t vSize;
  bufsize_t curr;
  offset_t bgnRaw;
  offset_t bgnVA;
  SectionHdrWrapper *sec;
  undefined1 local_58 [8];
  WatchedLocker lock;
  offset_t raw_local;
  PEFile *this_local;
  
  lock._48_8_ = raw;
  WatchedLocker::WatchedLocker((WatchedLocker *)local_58,&this->m_peMutex,false,"rawToRva");
  uVar1 = lock._48_8_;
  iVar2 = (*(this->super_MappedExe).super_Executable.super_AbstractByteBuffer.
            _vptr_AbstractByteBuffer[0xf])(this,1);
  if ((ulong)uVar1 < CONCAT44(extraout_var,iVar2)) {
    this_00 = _getSecHdrAtOffset(this,lock._48_8_,RAW,true,false);
    if (this_00 == (SectionHdrWrapper *)0x0) {
      sVar7 = _getSectionsCount(this,true);
      uVar1 = lock._48_8_;
      if (sVar7 == 0) {
        this_local = (PEFile *)lock._48_8_;
      }
      else {
        bVar6 = hdrsSize(this);
        if ((ulong)uVar1 < bVar6) {
          this_local = (PEFile *)lock._48_8_;
        }
        else {
          this_local = (PEFile *)0xffffffffffffffff;
        }
      }
    }
    else {
      oVar3 = SectionHdrWrapper::getContentOffset(this_00,VA,true);
      oVar4 = SectionHdrWrapper::getContentOffset(this_00,RAW,true);
      if ((oVar3 == 0xffffffffffffffff) || (oVar4 == 0xffffffffffffffff)) {
        this_local = (PEFile *)0xffffffffffffffff;
      }
      else {
        uVar5 = lock._48_8_ - oVar4;
        bVar6 = SectionHdrWrapper::getContentSize(this_00,VA,true);
        if (uVar5 < bVar6) {
          this_local = (PEFile *)(oVar3 + uVar5);
        }
        else {
          this_local = (PEFile *)0xffffffffffffffff;
        }
      }
    }
  }
  else {
    this_local = (PEFile *)0xffffffffffffffff;
  }
  WatchedLocker::~WatchedLocker((WatchedLocker *)local_58);
  return (offset_t)this_local;
}

Assistant:

offset_t PEFile::rawToRva(offset_t raw)
{
    WatchedLocker lock(&m_peMutex, PE_SHOW_LOCK, __FUNCTION__);
    if (raw >= this->getMappedSize(Executable::RAW)) return INVALID_ADDR;

    SectionHdrWrapper* sec = this->_getSecHdrAtOffset(raw, Executable::RAW, true);
    if (sec) {
        offset_t bgnVA = sec->getContentOffset(Executable::VA);
        offset_t bgnRaw = sec->getContentOffset(Executable::RAW);
        if (bgnVA  == INVALID_ADDR || bgnRaw == INVALID_ADDR) return INVALID_ADDR;

        bufsize_t curr = (raw - bgnRaw);
       
        bufsize_t vSize = sec->getContentSize(Executable::VA, true);
        if (curr >= vSize) {
            //address out of section
            return INVALID_ADDR;
        }
        return bgnVA + curr;
    }
    //TODO: make more tests
    if (this->_getSectionsCount() == 0) return raw;
    if (raw < this->hdrsSize()) {
        return raw;
    } //else: content that is between the end of sections headers and the first virtual section is not mapped
    return INVALID_ADDR;
}